

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

RK_U8 * mpp_align_get_bits(BitReadCtx_t *bitctx)

{
  int iVar1;
  int iVar2;
  MPP_RET MVar3;
  RK_S32 bits_left;
  int iVar4;
  
  iVar1 = bitctx->num_remaining_bits_in_curr_byte_;
  iVar4 = iVar1;
  if (iVar1 != 0) {
    do {
      iVar2 = bitctx->num_remaining_bits_in_curr_byte_;
      if (iVar4 <= iVar2) {
        bitctx->num_remaining_bits_in_curr_byte_ = iVar2 - iVar4;
        bitctx->used_bits = bitctx->used_bits + iVar1;
        break;
      }
      MVar3 = (*bitctx->update_curbyte)(bitctx);
      iVar4 = iVar4 - iVar2;
    } while (MVar3 == MPP_OK);
  }
  return bitctx->data_;
}

Assistant:

RK_U8 *mpp_align_get_bits(BitReadCtx_t *bitctx)
{
    int n = bitctx->num_remaining_bits_in_curr_byte_;
    if (n)
        mpp_skip_bits(bitctx, n);
    return bitctx->data_;
}